

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

exr_result_t exr_attr_string_set(exr_context_t ctxt,exr_attr_string_t *s,char *d)

{
  exr_result_t eVar1;
  size_t sVar2;
  
  if (d == (char *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = strlen(d);
    if (0x7ffffffe < sVar2) {
      if (ctxt == (exr_context_t)0x0) {
        return 2;
      }
      eVar1 = (*ctxt->report_error)(ctxt,3,"Invalid string too long for attribute");
      return eVar1;
    }
  }
  eVar1 = exr_attr_string_set_with_length(ctxt,s,d,(int32_t)sVar2);
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_string_set (exr_context_t ctxt, exr_attr_string_t* s, const char* d)
{
    size_t  fulllen = 0;
    int32_t len     = 0;
    if (d)
    {
        fulllen = strlen (d);
        if (fulllen >= (size_t) INT32_MAX)
        {
            if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;
            return ctxt->report_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid string too long for attribute");
        }
        len = (int32_t) fulllen;
    }
    return exr_attr_string_set_with_length (ctxt, s, d, len);
}